

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall xray_re::xr_bone::load_1(xr_bone *this,xr_reader *r)

{
  fvector3 *v;
  float *pfVar1;
  uint __line;
  size_t sVar2;
  char *__assertion;
  uint16_t version;
  
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,1,&version);
  if (sVar2 == 0) {
    __assertion = "0";
    __line = 0x19;
  }
  else if ((ushort)(version - 1) < 2) {
    sVar2 = xr_reader::find_chunk(r,2);
    if (sVar2 == 0) {
      __assertion = "0";
      __line = 0x1d;
    }
    else {
      xr_reader::r_sz(r,&this->m_name);
      xr_reader::r_sz(r,&this->m_parent_name);
      xr_reader::r_sz(r,&this->m_vmap_name);
      sVar2 = xr_reader::find_chunk(r,3);
      if (sVar2 != 0) {
        v = &this->m_bind_offset;
        xr_reader::r_fvector3(r,v);
        xr_reader::r_fvector3(r,&this->m_bind_rotate);
        pfVar1 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
        this->m_bind_length = *pfVar1;
        if (version == 1) {
          *(ulong *)&v->field_0 =
               CONCAT44((int)*(undefined8 *)&v->field_0,
                        (int)((ulong)*(undefined8 *)&v->field_0 >> 0x20));
        }
        load_data(this,r);
        return;
      }
      __assertion = "0";
      __line = 0x24;
    }
  }
  else {
    __assertion = "version == BONE_VERSION_1 || version == BONE_VERSION";
    __line = 0x1a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                ,__line,"void xray_re::xr_bone::load_1(xr_reader &)");
}

Assistant:

void xr_bone::load_1(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(BONE_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == BONE_VERSION_1 || version == BONE_VERSION);

	if (!r.find_chunk(BONE_CHUNK_DEF))
		xr_not_expected();
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	r.r_sz(m_vmap_name);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_BIND_POSE))
		xr_not_expected();
	r.r_fvector3(m_bind_offset);
	r.r_fvector3(m_bind_rotate);
	m_bind_length = r.r_float();
	r.debug_find_chunk();
	if (version == BONE_VERSION_1)
		std::swap(m_bind_offset.x, m_bind_offset.y);

	load_data(r);
}